

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuNumberField::MenuEvent(FOptionMenuNumberField *this,int mkey,bool fromcontroller)

{
  FBaseCVar *pFVar1;
  bool bVar2;
  undefined4 extraout_var;
  float volume;
  FSoundID local_44;
  UCVarValue local_40;
  float local_38;
  undefined4 uStack_34;
  UCVarValue vval;
  float local_24;
  byte local_1d;
  float value;
  bool fromcontroller_local;
  FOptionMenuNumberField *pFStack_18;
  int mkey_local;
  FOptionMenuNumberField *this_local;
  
  if ((this->super_FOptionMenuFieldBase).mCVar != (FBaseCVar *)0x0) {
    pFVar1 = (this->super_FOptionMenuFieldBase).mCVar;
    local_1d = fromcontroller;
    value = (float)mkey;
    pFStack_18 = this;
    vval._0_4_ = (float)(*pFVar1->_vptr_FBaseCVar[4])(pFVar1,2);
    vval._4_4_ = extraout_var;
    if (value == 2.8026e-45) {
      local_24 = vval._0_4_ - this->mStep;
      if (local_24 < this->mMinimum) {
        local_24 = this->mMaximum;
      }
    }
    else {
      if ((value != 4.2039e-45) && (value != 8.40779e-45)) {
        local_24 = vval._0_4_;
        bVar2 = FListMenuItem::MenuEvent((FListMenuItem *)this,(int)value,(bool)(local_1d & 1));
        return bVar2;
      }
      local_24 = this->mStep + vval._0_4_;
      if (this->mMaximum <= local_24 && local_24 != this->mMaximum) {
        local_24 = this->mMinimum;
      }
    }
    local_38 = local_24;
    local_40._4_4_ = uStack_34;
    local_40.Float = local_24;
    FBaseCVar::SetGenericRep((this->super_FOptionMenuFieldBase).mCVar,local_40,CVAR_Float);
    FSoundID::FSoundID(&local_44,"menu/change");
    volume = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_44,volume,0.0);
  }
  return true;
}

Assistant:

bool MenuEvent ( int mkey, bool fromcontroller )
	{
		if ( mCVar )
		{
			float value = mCVar->GetGenericRep( CVAR_Float ).Float;

			if ( mkey == MKEY_Left )
			{
				value -= mStep;

				if ( value < mMinimum )
					value = mMaximum;
			}
			else if ( mkey == MKEY_Right || mkey == MKEY_Enter )
			{
				value += mStep;

				if ( value > mMaximum )
					value = mMinimum;
			}
			else
				return FOptionMenuItem::MenuEvent( mkey, fromcontroller );

			UCVarValue vval;
			vval.Float = value;
			mCVar->SetGenericRep( vval, CVAR_Float );
			S_Sound( CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE );
		}

		return true;
	}